

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::WATParser::GlobalType> *
wasm::WATParser::globaltype<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::WATParser::GlobalType> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  bool bVar1;
  bool bVar2;
  string_view expected;
  undefined1 local_c0 [8];
  Result<wasm::Type> type;
  string local_78 [32];
  undefined1 local_58 [8];
  Result<wasm::Type> _val;
  
  this = &ctx->in;
  expected._M_str = "mut";
  expected._M_len = 3;
  bVar1 = Lexer::takeSExprStart(this,expected);
  valtype<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Type> *)local_c0,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_58,
             (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_c0);
  if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string(local_78,(string *)local_58);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::GlobalType,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::WATParser::GlobalType,wasm::Err> *)
               __return_storage_ptr__,local_78);
    std::__cxx11::string::~string(local_78);
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_58);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_58);
    if (bVar1) {
      bVar2 = Lexer::takeRParen(this);
      if (!bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                   "expected end of globaltype",(allocator<char> *)local_78);
        Lexer::err((Err *)local_58,this,
                   (string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::WATParser::GlobalType,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::WATParser::GlobalType,wasm::Err> *)
                   __return_storage_ptr__,local_58);
        std::__cxx11::string::~string((string *)local_58);
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        goto LAB_00c3c6d0;
      }
    }
    *(uint *)&(__return_storage_ptr__->val).
              super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> = (uint)bVar1;
    ((_Uninitialized<wasm::Type,_true> *)
    ((long)&(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 8))->_M_storage =
         (Type)local_c0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20) = '\0';
  }
LAB_00c3c6d0:
  std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::GlobalTypeT> globaltype(Ctx& ctx) {
  auto mutability = Immutable;
  if (ctx.in.takeSExprStart("mut"sv)) {
    mutability = Mutable;
  }

  auto type = valtype(ctx);
  CHECK_ERR(type);

  if (mutability == Mutable && !ctx.in.takeRParen()) {
    return ctx.in.err("expected end of globaltype");
  }

  return ctx.makeGlobalType(mutability, *type);
}